

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

void __thiscall CfgNode::BlockData::addCall(BlockData *this,CFG *cfg,unsigned_long_long count)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  mapped_type pCVar3;
  mapped_type *ppCVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  Addr addr;
  ulong local_28;
  
  local_28 = cfg->m_addr;
  p_Var1 = &(this->m_calls)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < local_28]) {
    if (*(ulong *)(p_Var6 + 1) >= local_28) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, local_28 < *(ulong *)(p_Var5 + 1)))
  {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    pCVar3 = (mapped_type)operator_new(0x18);
    pCVar3->_vptr_CfgCall = (_func_int **)&PTR__CfgCall_0012a878;
    pCVar3->m_called = cfg;
    pCVar3->m_count = count;
    ppCVar4 = std::
              map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
              ::operator[](&this->m_calls,&local_28);
    *ppCVar4 = pCVar3;
  }
  else {
    pp_Var2 = &(p_Var6[1]._M_parent)->_M_left;
    *pp_Var2 = (_Base_ptr)((long)&(*pp_Var2)->_M_color + count);
  }
  return;
}

Assistant:

void CfgNode::BlockData::addCall(CFG* cfg, unsigned long long count) {
	Addr addr = cfg->addr();
	std::map<Addr, CfgCall*>::const_iterator it = m_calls.find(addr);
	if (it != m_calls.end()) {
		CfgCall* cfgCall = it->second;
		cfgCall->updateCount(count);
	} else {
		CfgCall* cfgCall = new CfgCall(cfg, count);
		m_calls[addr] = cfgCall;
	}
}